

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::FieldOptions::MergePartialFromCodedStream
          (FieldOptions *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  bool bVar5;
  uint32 uVar6;
  UnknownFieldSet *pUVar7;
  UninterpretedOption *value_00;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  bool *value_01;
  int value_1;
  int value;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *local_58;
  bool *local_50;
  bool *local_48;
  bool *local_40;
  bool *local_38;
  
  local_58 = &this->uninterpreted_option_;
  local_38 = &this->weak_;
  local_40 = &this->lazy_;
  local_48 = &this->deprecated_;
  local_50 = &this->packed_;
LAB_005dc3ac:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      pbVar1 = pbVar3 + 1;
      uVar9 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar6 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar6 = (uint)bVar2, (~(uint)*pbVar1 & uVar9) < 0x80)
           ) goto LAB_005dc5b1;
        uVar9 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = (ulong)uVar9 | 0x100000000;
    }
    else {
LAB_005dc5b1:
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    uVar9 = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_005dc463_caseD_4;
    uVar4 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar10;
    switch(uVar4) {
    case 1:
      if (cVar8 == '\b') {
        bVar5 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value);
        if (!bVar5) {
          return false;
        }
        if ((uint)value < 3) {
          set_ctype(this,value);
        }
        else {
          pUVar7 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar7,1,(long)value);
        }
        goto LAB_005dc3ac;
      }
      break;
    case 2:
      if (cVar8 != '\x10') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      value_01 = local_50;
LAB_005dc53a:
      bVar5 = internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,value_01);
      goto LAB_005dc53f;
    case 3:
      if (cVar8 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
        value_01 = local_48;
        goto LAB_005dc53a;
      }
      break;
    case 4:
    case 7:
    case 8:
    case 9:
      break;
    case 5:
      if (cVar8 == '(') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        value_01 = local_40;
        goto LAB_005dc53a;
      }
      break;
    case 6:
      if (cVar8 == '0') {
        bVar5 = internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value_1);
        if (!bVar5) {
          return false;
        }
        if ((uint)value_1 < 3) {
          set_jstype(this,value_1);
        }
        else {
          pUVar7 = mutable_unknown_fields(this);
          UnknownFieldSet::AddVarint(pUVar7,6,(long)value_1);
        }
        goto LAB_005dc3ac;
      }
      break;
    case 10:
      if (cVar8 == 'P') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
        value_01 = local_38;
        goto LAB_005dc53a;
      }
      break;
    default:
      if ((uVar4 == 999) && (cVar8 == ':')) {
        value_00 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add(local_58);
        bVar5 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::UninterpretedOption>(input,value_00);
        goto LAB_005dc53f;
      }
    }
switchD_005dc463_caseD_4:
    if (uVar9 == 0) {
      return true;
    }
    if ((uVar9 & 7) == 4) {
      return true;
    }
    pUVar7 = mutable_unknown_fields(this);
    if (uVar9 < 8000) {
      bVar5 = internal::WireFormat::SkipField(input,uVar9,pUVar7);
    }
    else {
      bVar5 = internal::ExtensionSet::ParseField
                        (&this->_extensions_,uVar9,input,(Message *)&_FieldOptions_default_instance_
                         ,pUVar7);
    }
LAB_005dc53f:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.FieldOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_CType_IsValid(value)) {
            set_ctype(static_cast< ::google::protobuf::FieldOptions_CType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool packed = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_packed();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &packed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool deprecated = 3 [default = false];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool lazy = 5 [default = false];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_lazy();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &lazy_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldOptions_JSType_IsValid(value)) {
            set_jstype(static_cast< ::google::protobuf::FieldOptions_JSType >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool weak = 10 [default = false];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_weak();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &weak_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.FieldOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.FieldOptions)
  return false;
#undef DO_
}